

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O1

Error asmjit::X86Logging_formatImmShuf(StringBuilder *sb,uint32_t u8,uint32_t bits,uint32_t count)

{
  Error EVar1;
  Error EVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  
  EVar1 = StringBuilder::_opChar(sb,1,'<');
  if (EVar1 == 0) {
    bVar5 = count != 0;
    if (bVar5) {
      uVar4 = 1;
      do {
        if ((uVar4 == 1) || (EVar2 = StringBuilder::_opChar(sb,1,'|'), EVar2 == 0)) {
          EVar2 = StringBuilder::_opNumber(sb,1,(ulong)(u8 & ~(-1 << (bits & 0x1f))),0,0,0);
          bVar6 = EVar2 == 0;
          if (!bVar6) {
            EVar1 = EVar2;
          }
        }
        else {
          bVar6 = false;
          EVar1 = EVar2;
        }
        if (!bVar6) break;
        u8 = u8 >> (bits & 0x1f);
        bVar5 = uVar4 < count;
        iVar3 = (1 - count) + uVar4;
        uVar4 = uVar4 + 1;
      } while (iVar3 != 1);
    }
    if (!bVar5) {
      EVar1 = StringBuilder::_opChar(sb,1,'>');
      return EVar1;
    }
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmShuf(StringBuilder& sb, uint32_t u8, uint32_t bits, uint32_t count) noexcept {
  ASMJIT_PROPAGATE(sb.appendChar('<'));
  uint32_t mask = (1 << bits) - 1;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits) {
    uint32_t value = u8 & mask;
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendChar('|'));
    ASMJIT_PROPAGATE(sb.appendUInt(value));
  }

  return sb.appendChar('>');
}